

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall rcg::System::~System(System *this)

{
  element_type *peVar1;
  long in_RDI;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *unaff_retaddr;
  
  if ((0 < *(int *)(in_RDI + 0x68)) && (*(long *)(in_RDI + 0x70) != 0)) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x110383);
    (*peVar1->TLClose)(*(TL_HANDLE *)(in_RDI + 0x70));
  }
  peVar1 = std::
           __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1103a7);
  (*peVar1->GCCloseLib)();
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  ~vector(unaff_retaddr);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1103d1);
  std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x1103df);
  std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x1103ed);
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  std::enable_shared_from_this<rcg::System>::~enable_shared_from_this
            ((enable_shared_from_this<rcg::System> *)0x110405);
  return;
}

Assistant:

System::~System()
{
  if (n_open > 0 && tl != 0)
  {
    gentl->TLClose(tl);
  }

  gentl->GCCloseLib();
}